

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O1

void __thiscall wasm::ExtractFunctionIndex::run(ExtractFunctionIndex *this,Module *module)

{
  ostream *poVar1;
  pointer puVar2;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var3;
  undefined1 __nptr [8];
  int *piVar4;
  ulong uVar5;
  pointer pcVar6;
  char *in_R8;
  Name name;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [23];
  undefined1 local_78 [8];
  string index;
  long local_48;
  int local_34;
  
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"extract-function-index","");
  index.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&index.field_2 + 8),
             "ExtractFunctionIndex usage: wasm-opt --extract-function-index=FUNCTION_INDEX","");
  Pass::getArgument((string *)local_78,&this->super_Pass,(string *)local_200,
                    (string *)((long)&index.field_2 + 8));
  if ((long *)index.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)index.field_2._8_8_,local_48 + 1);
  }
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
  }
  __nptr = local_78;
  if (index._M_dataplus._M_p != (pointer)0x0) {
    pcVar6 = (pointer)0x0;
    do {
      if (9 < (int)*(char *)((long)local_78 + (long)pcVar6) - 0x30U) {
        Fatal::Fatal((Fatal *)local_200);
        Fatal::operator<<((Fatal *)local_200,(char (*) [32])"Expected numeric function index");
        goto LAB_00868f0b;
      }
      pcVar6 = pcVar6 + 1;
    } while (index._M_dataplus._M_p != pcVar6);
  }
  piVar4 = __errno_location();
  local_34 = *piVar4;
  *piVar4 = 0;
  uVar5 = strtol((char *)__nptr,(char **)local_200,10);
  if ((undefined1  [8])local_200._0_8_ == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)uVar5 == uVar5) && (*piVar4 != 0x22)) {
    if (*piVar4 == 0) {
      *piVar4 = local_34;
    }
    puVar2 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar5 & 0xffffffff) <
        (ulong)((long)(module->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
      _Var3._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           puVar2[uVar5 & 0xffffffff]._M_t.
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
      name.super_IString.str._M_str = in_R8;
      name.super_IString.str._M_len =
           *(size_t *)
            ((long)_Var3._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
      wasm::extract((wasm *)(this->super_Pass).runner,(PassRunner *)module,
                    *(Module **)
                     _Var3._M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,name);
      if (local_78 != (undefined1  [8])&index._M_string_length) {
        operator_delete((void *)local_78,index._M_string_length + 1);
      }
      return;
    }
    Fatal::Fatal((Fatal *)local_200);
    poVar1 = (ostream *)(local_200 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Out of bounds function index ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"! (module has only ",0x13);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    Fatal::operator<<((Fatal *)local_200,(char (*) [12])" functions)");
LAB_00868f0b:
    Fatal::~Fatal((Fatal *)local_200);
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

void run(Module* module) override {
    std::string index = getArgument("extract-function-index",
                                    "ExtractFunctionIndex usage: wasm-opt "
                                    "--extract-function-index=FUNCTION_INDEX");
    for (char c : index) {
      if (!std::isdigit(c)) {
        Fatal() << "Expected numeric function index";
      }
    }
    Index i = std::stoi(index);
    if (i >= module->functions.size()) {
      Fatal() << "Out of bounds function index " << i << "! (module has only "
              << module->functions.size() << " functions)";
    }
    // Assumes imports are at the beginning
    Name name = module->functions[i]->name;
    extract(getPassRunner(), module, name);
  }